

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> * __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::With
          (MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
           *__return_storage_ptr__,
          FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
          *this,Matcher<const_std::vector<char,_std::allocator<char>_>_&> *m,
          Matcher<unsigned_long> *m_1)

{
  tuple<testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  local_58;
  Matcher<unsigned_long> *local_28;
  Matcher<unsigned_long> *m_local_1;
  Matcher<const_std::vector<char,_std::allocator<char>_>_&> *m_local;
  FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this_local
  ;
  
  local_28 = m_1;
  m_local_1 = (Matcher<unsigned_long> *)m;
  m_local = (Matcher<const_std::vector<char,_std::allocator<char>_>_&> *)this;
  this_local = (FunctionMocker<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>
                *)__return_storage_ptr__;
  std::
  make_tuple<testing::Matcher<std::vector<char,std::allocator<char>>const&>,testing::Matcher<unsigned_long>>
            (&local_58,m,m_1);
  MockSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::MockSpec
            (__return_storage_ptr__,this,&local_58);
  std::
  tuple<testing::Matcher<const_std::vector<char,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_long>_>
  ::~tuple(&local_58);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }